

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::TimeScaleFunc::checkArguments
          (TimeScaleFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  LanguageVersion LVar1;
  Compilation *pCVar2;
  bool bVar3;
  Diagnostic *this_00;
  long lVar4;
  char *pcVar5;
  string_view arg;
  
  pCVar2 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,
                     (ulong)this->isOptional ^ 1,1);
  if (bVar3) {
    if ((this->isOptional == true) && (LVar1 = (pCVar2->options).languageVersion, (int)LVar1 < 1)) {
      this_00 = ASTContext::addDiag(context,(DiagCode)0x20001,range);
      pcVar5 = "";
      if (LVar1 == Default) {
        pcVar5 = "1800-2017";
      }
      arg._M_str = pcVar5;
      arg._M_len = (ulong)(LVar1 == Default) * 9;
      Diagnostic::operator<<(this_00,arg);
    }
    lVar4 = 0x158;
    if (((args->_M_extent)._M_extent_value == 0) ||
       (((ulong)**(uint **)(*args->_M_ptr + 1) < 0x30 &&
        ((0x80000000000aU >> ((ulong)**(uint **)(*args->_M_ptr + 1) & 0x3f) & 1) != 0))))
    goto LAB_003f79ac;
    bVar3 = Scope::isUninstantiated((context->scope).ptr);
    if (!bVar3) {
      ASTContext::addDiag(context,(DiagCode)0xb000b,(*args->_M_ptr)->sourceRange);
    }
  }
  lVar4 = 400;
LAB_003f79ac:
  return *(Type **)((long)&(pCVar2->super_BumpAllocator).head + lVar4);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, isOptional ? 0 : 1, 1))
            return comp.getErrorType();

        if (isOptional) {
            auto languageVersion = comp.languageVersion();
            if (languageVersion < LanguageVersion::v1800_2023)
                context.addDiag(diag::WrongLanguageVersion, range) << toString(languageVersion);
        }

        if (args.size() > 0) {
            auto& sym = *args[0]->as<ArbitrarySymbolExpression>().symbol;
            if (sym.kind != SymbolKind::Instance && sym.kind != SymbolKind::CompilationUnit &&
                sym.kind != SymbolKind::Root) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleName, args[0]->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getIntType();
    }